

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::Handshake(Error *__return_storage_ptr__,DtlsSession *this)

{
  int aMbedtlsError;
  char *begin;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  allocator local_c9;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  code *local_a0;
  string local_90;
  string local_70;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState != kConnecting) {
    return __return_storage_ptr__;
  }
  aMbedtlsError = mbedtls_ssl_handshake(&this->mSsl);
  if (((this->mState == kConnecting) && ((this->mSsl).state == 0x1b)) &&
     (this->mState = kConnected,
     (this->mOnConnected).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_50._0_4_ = kNone;
    local_48._M_p = (pointer)&local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator()
              (&this->mOnConnected,this,(Error *)local_50);
    std::__cxx11::string::~string((string *)&local_48);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator=
              (&this->mOnConnected,(nullptr_t)0x0);
  }
  if (aMbedtlsError == -0x6800) {
    std::__cxx11::string::string((string *)&local_70,"dtls",&local_c9);
    local_c8._0_4_ = pointer_type;
    local_c0._M_p = "session(={}) handshake timeout";
    local_b8 = 0x1e;
    local_b0._M_allocated_capacity = 0x100000000;
    local_a0 = ::fmt::v10::detail::
               parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    pcVar1 = "session(={}) handshake timeout";
    local_b0._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_c8;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_c8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_c8;
    fmt.size_ = 0xe;
    fmt.data_ = (char *)0x1e;
    local_c8 = (undefined1  [8])this;
    ::fmt::v10::vformat_abi_cxx11_(&local_90,(v10 *)"session(={}) handshake timeout",fmt,args);
    Log(kError,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else if (aMbedtlsError == -0x6a80) {
    Reconnect(this);
    local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffff00000000);
    local_c0._M_p = (pointer)&local_b0;
    local_b8 = 0;
    local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
    Error::operator=(__return_storage_ptr__,(Error *)local_c8);
    goto LAB_001b2a20;
  }
  ErrorFromMbedtlsError((Error *)local_c8,aMbedtlsError);
  Error::operator=(__return_storage_ptr__,(Error *)local_c8);
LAB_001b2a20:
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Handshake()
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnecting);

    rval = mbedtls_ssl_handshake(&mSsl);

    if (mState == State::kConnecting && mSsl.state == MBEDTLS_SSL_HANDSHAKE_OVER)
    {
        mState = State::kConnected;
        if (mOnConnected != nullptr)
        {
            mOnConnected(*this, ERROR_NONE);
            mOnConnected = nullptr;
        }
    }

    switch (rval)
    {
    case MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED:
        Reconnect();
        error = ERROR_NONE;
        break;

    case MBEDTLS_ERR_SSL_TIMEOUT:
        LOG_ERROR(LOG_REGION_DTLS, "session(={}) handshake timeout", static_cast<void *>(this));

        // Fall through

    default:
        error = ErrorFromMbedtlsError(rval);
        break;
    }

exit:
    return error;
}